

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopPeeling::PeelAfter(LoopPeeling *this,uint32_t peel_factor)

{
  IRContext *pIVar1;
  bool bVar2;
  Analysis AVar3;
  uint32_t op1;
  uint32_t op2;
  Instruction *pIVar4;
  Loop *pLVar5;
  Loop *pLVar6;
  BasicBlock *pBVar7;
  anon_class_24_3_680879f0 local_1b8;
  function<void_(spvtools::opt::Instruction_*)> local_1a0;
  BasicBlock *local_180;
  BasicBlock *if_block;
  LoopPeeling *local_170;
  function<unsigned_int_(spvtools::opt::Instruction_*)> local_168;
  Instruction *local_148;
  Instruction *has_remaining_iteration;
  Instruction *factor;
  undefined1 local_130 [8];
  InstructionBuilder builder;
  LoopCloningResult clone_results;
  uint32_t peel_factor_local;
  LoopPeeling *this_local;
  
  bVar2 = CanPeelLoop(this);
  if (!bVar2) {
    __assert_fail("CanPeelLoop() && \"Cannot peel loop\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x1dd,"void spvtools::opt::LoopPeeling::PeelAfter(uint32_t)");
  }
  LoopUtils::LoopCloningResult::LoopCloningResult((LoopCloningResult *)&builder.preserved_analyses_)
  ;
  DuplicateAndConnectLoop(this,(LoopCloningResult *)&builder.preserved_analyses_);
  InsertCanonicalInductionVariable(this,(LoopCloningResult *)&builder.preserved_analyses_);
  pIVar1 = this->context_;
  Loop::GetPreHeaderBlock(this->cloned_loop_);
  BasicBlock::tail((BasicBlock *)&factor);
  pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)&factor);
  AVar3 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)local_130,pIVar1,pIVar4,AVar3);
  bVar2 = analysis::Integer::IsSigned(this->int_type_);
  has_remaining_iteration =
       InstructionBuilder::GetIntConstant<unsigned_int>
                 ((InstructionBuilder *)local_130,peel_factor,bVar2);
  op1 = opt::Instruction::result_id(has_remaining_iteration);
  op2 = opt::Instruction::result_id(this->loop_iteration_count_);
  local_148 = InstructionBuilder::AddLessThan((InstructionBuilder *)local_130,op1,op2);
  if_block = (BasicBlock *)has_remaining_iteration;
  local_170 = this;
  std::function<unsigned_int(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopPeeling::PeelAfter(unsigned_int)::__0,void>
            ((function<unsigned_int(spvtools::opt::Instruction*)> *)&local_168,
             (anon_class_16_2_d97e2788 *)&if_block);
  FixExitCondition(this,&local_168);
  std::function<unsigned_int_(spvtools::opt::Instruction_*)>::~function(&local_168);
  pLVar5 = GetClonedLoop(this);
  pLVar6 = GetOriginalLoop(this);
  pBVar7 = Loop::GetPreHeaderBlock(pLVar6);
  pBVar7 = CreateBlockBefore(this,pBVar7);
  Loop::SetMergeBlock(pLVar5,pBVar7);
  pIVar4 = local_148;
  pLVar5 = this->cloned_loop_;
  pLVar6 = GetOriginalLoop(this);
  pBVar7 = Loop::GetPreHeaderBlock(pLVar6);
  local_180 = ProtectLoop(this,pLVar5,pIVar4,pBVar7);
  pLVar5 = GetOriginalLoop(this);
  pBVar7 = Loop::GetHeaderBlock(pLVar5);
  local_1b8.clone_results = (LoopCloningResult *)&builder.preserved_analyses_;
  local_1b8.if_block = local_180;
  local_1b8.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopPeeling::PeelAfter(unsigned_int)::__1,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_1a0,&local_1b8);
  BasicBlock::ForEachPhiInst(pBVar7,&local_1a0,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_1a0);
  pIVar1 = this->context_;
  AVar3 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar3 = opt::operator|(AVar3,kAnalysisLoopAnalysis);
  AVar3 = opt::operator|(AVar3,kAnalysisCFG);
  IRContext::InvalidateAnalysesExceptFor(pIVar1,AVar3);
  LoopUtils::LoopCloningResult::~LoopCloningResult
            ((LoopCloningResult *)&builder.preserved_analyses_);
  return;
}

Assistant:

void LoopPeeling::PeelAfter(uint32_t peel_factor) {
  assert(CanPeelLoop() && "Cannot peel loop");
  LoopUtils::LoopCloningResult clone_results;

  // Clone the loop and insert the cloned one before the loop.
  DuplicateAndConnectLoop(&clone_results);

  // Add a canonical induction variable "canonical_induction_variable_".
  InsertCanonicalInductionVariable(&clone_results);

  InstructionBuilder builder(
      context_, &*cloned_loop_->GetPreHeaderBlock()->tail(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* factor =
      builder.GetIntConstant(peel_factor, int_type_->IsSigned());

  Instruction* has_remaining_iteration = builder.AddLessThan(
      factor->result_id(), loop_iteration_count_->result_id());

  // Change the exit condition of the cloned loop to be (exit when become
  // false):
  //  "canonical_induction_variable_" + "factor" < "loop_iteration_count_"
  FixExitCondition([factor, this](Instruction* insert_before_point) {
    InstructionBuilder cond_builder(
        context_, insert_before_point,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    // Build the following check: canonical_induction_variable_ + factor <
    // iteration_count
    return cond_builder
        .AddLessThan(cond_builder
                         .AddIAdd(canonical_induction_variable_->type_id(),
                                  canonical_induction_variable_->result_id(),
                                  factor->result_id())
                         ->result_id(),
                     loop_iteration_count_->result_id())
        ->result_id();
  });

  // "Protect" the first loop: the first loop can only be executed if
  // factor < loop_iteration_count_.

  // The original loop's pre-header was the cloned loop merge block.
  GetClonedLoop()->SetMergeBlock(
      CreateBlockBefore(GetOriginalLoop()->GetPreHeaderBlock()));
  // Use the second loop preheader as if merge block.

  // Prevent the first loop if only the peeled loop needs it.
  BasicBlock* if_block = ProtectLoop(cloned_loop_, has_remaining_iteration,
                                     GetOriginalLoop()->GetPreHeaderBlock());

  // Patch the phi of the header block.
  // We added an if to enclose the first loop and because the phi node are
  // connected to the exit value of the first loop, the definition no longer
  // dominate the preheader.
  // We had to the preheader (our if merge block) the required phi instruction
  // and patch the header phi.
  GetOriginalLoop()->GetHeaderBlock()->ForEachPhiInst(
      [&clone_results, if_block, this](Instruction* phi) {
        analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

        auto find_value_idx = [](Instruction* phi_inst, Loop* loop) {
          uint32_t preheader_value_idx =
              !loop->IsInsideLoop(phi_inst->GetSingleWordInOperand(1)) ? 0 : 2;
          return preheader_value_idx;
        };

        Instruction* cloned_phi =
            def_use_mgr->GetDef(clone_results.value_map_.at(phi->result_id()));
        uint32_t cloned_preheader_value = cloned_phi->GetSingleWordInOperand(
            find_value_idx(cloned_phi, GetClonedLoop()));

        Instruction* new_phi =
            InstructionBuilder(context_,
                               &*GetOriginalLoop()->GetPreHeaderBlock()->tail(),
                               IRContext::kAnalysisDefUse |
                                   IRContext::kAnalysisInstrToBlockMapping)
                .AddPhi(phi->type_id(),
                        {phi->GetSingleWordInOperand(
                             find_value_idx(phi, GetOriginalLoop())),
                         GetClonedLoop()->GetMergeBlock()->id(),
                         cloned_preheader_value, if_block->id()});

        phi->SetInOperand(find_value_idx(phi, GetOriginalLoop()),
                          {new_phi->result_id()});
        def_use_mgr->AnalyzeInstUse(phi);
      });

  context_->InvalidateAnalysesExceptFor(
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping |
      IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisCFG);
}